

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cargo.c
# Opt level: O3

char * TEST_highlight_args(void)

{
  int iVar1;
  char *__s;
  char *pcVar2;
  char *pcVar3;
  char *pcVar4;
  cargo_t cargo;
  
  iVar1 = cargo_init(&cargo,0,"program");
  if (iVar1 == 0) {
    puts("With color highlight & args:");
    puts("----------------------------");
    iVar1 = cargo_fprint_args(_stdout,8,(char **)&DAT_00131f20,1,0,0x50,3,1,"^\x1b[22;31m",3,
                              "~\x1b[22;32m",4,"-");
    pcVar4 = "Failed call cargo_fprint_args";
    if (iVar1 == 0) {
      puts("With highlight & args:");
      puts("----------------------");
      iVar1 = cargo_fprint_args(_stdout,8,(char **)&DAT_00131f20,1,CARGO_FPRINT_NOCOLOR,0x50,3,1,
                                "^\x1b[22;31m",3,"~\x1b[22;32m",4,"-");
      if (iVar1 == 0) {
        puts("With highlight & no args:");
        puts("-------------------------");
        iVar1 = cargo_fprint_args(_stdout,8,(char **)&DAT_00131f20,1,CARGO_FPRINT_NOARGS,0x50,3,1,
                                  "^\x1b[22;31m",3,"~\x1b[22;32m",4,"-");
        if (iVar1 == 0) {
          puts("With no highlight & args:");
          puts("-------------------------");
          iVar1 = cargo_fprint_args(_stdout,8,(char **)&DAT_00131f20,1,CARGO_FPRINT_NOHIGHLIGHT,0x50
                                    ,3,1,"^\x1b[22;31m",3,"~\x1b[22;32m",4,"-");
          if (iVar1 == 0) {
            puts("With default & not ordered:");
            puts("-------------------------");
            __s = cargo_get_fprint_args
                            (8,(char **)&DAT_00131f20,1,0,0x50,3,3,"~\x1b[22;32m",1,"^\x1b[22;31m",4
                             ,"-");
            if (__s == (char *)0x0) {
              pcVar4 = "Failed call cargo_get_fprint_args";
            }
            else {
              puts(__s);
              pcVar4 = strstr(__s,"~~~~~~");
              if (pcVar4 == (char *)0x0) {
                pcVar4 = "Did not find highlight for --beta";
              }
              else {
                pcVar2 = strstr(__s,"^^^^^^^");
                if (pcVar2 == (char *)0x0) {
                  pcVar4 = "Did not find highlight for --alpha";
                }
                else {
                  pcVar3 = strstr(__s,"---");
                  if (pcVar3 == (char *)0x0) {
                    pcVar4 = "Did not find highlight for \'def\'";
                  }
                  else {
                    pcVar4 = (char *)0x0;
                    if (pcVar3 <= pcVar2) {
                      pcVar4 = "--beta highlight after --alpha";
                    }
                  }
                }
              }
              if (replaced_cargo_free == (cargo_free_f)0x0) {
                free(__s);
              }
              else {
                (*replaced_cargo_free)(__s);
              }
            }
          }
        }
      }
    }
    cargo_destroy(&cargo);
  }
  else {
    pcVar4 = "Failed to init cargo";
  }
  return pcVar4;
}

Assistant:

_TEST_START(TEST_highlight_args)
{
    char *args[] =
    {
        "program",
        "--alpha", "abc",
        "--beta", "def", "ghi",
        "--crazy", "banans"
    };
    char *s = NULL;
    int argc = sizeof(args) / sizeof(args[0]);

    printf("With color highlight & args:\n");
    printf("----------------------------\n");
    ret = cargo_fprint_args(stdout,
                        argc,
                        args,
                        1, // Start index.
                        0, // flags
                        CARGO_DEFAULT_MAX_WIDTH,
                        3, // Highlight count.
                        1, "^"CARGO_COLOR_RED,
                        3, "~"CARGO_COLOR_GREEN,
                        4, "-");
    cargo_assert(ret == 0, "Failed call cargo_fprint_args");

    printf("With highlight & args:\n");
    printf("----------------------\n");
    ret = cargo_fprint_args(stdout,
                        argc,
                        args,
                        1, // Start index.
                        CARGO_FPRINT_NOCOLOR, // flags
                        CARGO_DEFAULT_MAX_WIDTH,
                        3, // Highlight count.
                        1, "^"CARGO_COLOR_RED,
                        3, "~"CARGO_COLOR_GREEN,
                        4, "-");
    cargo_assert(ret == 0, "Failed call cargo_fprint_args");

    printf("With highlight & no args:\n");
    printf("-------------------------\n");
    ret = cargo_fprint_args(stdout,
                        argc,
                        args,
                        1, // Start index.
                        CARGO_FPRINT_NOARGS, // flags
                        CARGO_DEFAULT_MAX_WIDTH,
                        3, // Highlight count.
                        1, "^"CARGO_COLOR_RED, 3, "~"CARGO_COLOR_GREEN, 4, "-");
    cargo_assert(ret == 0, "Failed call cargo_fprint_args");

    printf("With no highlight & args:\n");
    printf("-------------------------\n");
    ret = cargo_fprint_args(stdout,
                        argc,
                        args,
                        1, // Start index.
                        CARGO_FPRINT_NOHIGHLIGHT, // flags
                        CARGO_DEFAULT_MAX_WIDTH,
                        3, // Highlight count.
                        1, "^"CARGO_COLOR_RED, 3, "~"CARGO_COLOR_GREEN, 4, "-");
    cargo_assert(ret == 0, "Failed call cargo_fprint_args");

    printf("With default & not ordered:\n");
    printf("-------------------------\n");
    s = cargo_get_fprint_args(
                        argc,
                        args,
                        1, // Start index.
                        0, // flags
                        CARGO_DEFAULT_MAX_WIDTH,
                        3, // Highlight count.
                        3, "~"CARGO_COLOR_GREEN, 1, "^"CARGO_COLOR_RED, 4, "-");
    cargo_assert(s, "Failed call cargo_get_fprint_args");
    printf("%s\n", s);
    cargo_assert(strstr(s, "~~~~~~"), "Did not find highlight for --beta");
    cargo_assert(strstr(s, "^^^^^^^"), "Did not find highlight for --alpha");
    cargo_assert(strstr(s, "---"), "Did not find highlight for 'def'");
    cargo_assert(strstr(s, "^^^^^^^") < strstr(s, "---"),
        "--beta highlight after --alpha");

    _TEST_CLEANUP();
    _cargo_xfree(&s);
}